

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Array<capnp::word> * __thiscall
capnp::_::StructReader::canonicalize(Array<capnp::word> *__return_storage_ptr__,StructReader *this)

{
  word *__src;
  size_t elementCount;
  bool bVar1;
  word *__s;
  word *__dest;
  size_t sVar2;
  word *ptrCopy;
  MessageSizeCounts MVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<capnp::word> array;
  Fault f;
  Array<capnp::word> backing;
  FlatMessageBuilder builder;
  Builder local_148;
  Fault local_130;
  word *local_128;
  size_t sStack_120;
  undefined8 *local_118;
  FlatMessageBuilder local_108;
  
  MVar3 = totalSize(this);
  sVar2 = MVar3.wordCount + 1;
  __s = (word *)kj::_::HeapArrayDisposer::allocateImpl
                          (8,sVar2,sVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  sVar2 = MVar3.wordCount + 1;
  local_118 = &kj::_::HeapArrayDisposer::instance;
  local_128 = __s;
  sStack_120 = sVar2;
  if (sVar2 != 0) {
    memset(__s,0,sVar2 * 8);
  }
  array.size_ = sVar2;
  array.ptr = __s;
  FlatMessageBuilder::FlatMessageBuilder(&local_108,array);
  MessageBuilder::getRootInternal(&local_148,&local_108.super_MessageBuilder);
  WireHelpers::zeroObject
            (local_148.builder.segment,local_148.builder.capTable,local_148.builder.pointer);
  (local_148.builder.pointer)->offsetAndKind = 0;
  (local_148.builder.pointer)->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  WireHelpers::setStructPointer
            (local_148.builder.segment,local_148.builder.capTable,local_148.builder.pointer,*this,
             (BuilderArena *)0x0,true);
  bVar1 = MessageBuilder::isCanonical(&local_108.super_MessageBuilder);
  if (bVar1) {
    AVar4 = MessageBuilder::getSegmentsForOutput(&local_108.super_MessageBuilder);
    __src = (AVar4.ptr)->ptr;
    elementCount = (AVar4.ptr)->size_;
    __dest = (word *)kj::_::HeapArrayDisposer::allocateImpl
                               (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    __return_storage_ptr__->ptr = __dest;
    __return_storage_ptr__->size_ = elementCount;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    if (elementCount != 0) {
      memcpy(__dest,__src,elementCount << 3);
    }
    FlatMessageBuilder::~FlatMessageBuilder(&local_108);
    if (__s != (word *)0x0) {
      local_128 = (word *)0x0;
      sStack_120 = 0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__s,8,sVar2,sVar2,
                 (_func_void_void_ptr *)0x0);
    }
    return __return_storage_ptr__;
  }
  local_130.exception = (Exception *)0x0;
  local_148.builder.segment = (SegmentBuilder *)0x0;
  local_148.builder.capTable = (CapTableBuilder *)0x0;
  kj::_::Debug::Fault::init
            (&local_130,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
            );
  kj::_::Debug::Fault::fatal(&local_130);
}

Assistant:

kj::Array<word> StructReader::canonicalize() {
  auto size = totalSize().wordCount + POINTER_SIZE_IN_WORDS;
  kj::Array<word> backing = kj::heapArray<word>(unbound(size / WORDS));
  WireHelpers::zeroMemory(backing.asPtr());
  FlatMessageBuilder builder(backing);
  _::PointerHelpers<AnyPointer>::getInternalBuilder(builder.initRoot<AnyPointer>()).setStruct(*this, true);
  KJ_ASSERT(builder.isCanonical());
  auto output = builder.getSegmentsForOutput()[0];
  kj::Array<word> trunc = kj::heapArray<word>(output.size());
  WireHelpers::copyMemory(trunc.begin(), output);
  return trunc;
}